

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapObjects.cpp
# Opt level: O0

RecyclableObject *
TTD::NSSnapObjects::DoObjectInflation_SnapDate(SnapObject *snpObject,InflateMap *inflator)

{
  ScriptContext *this;
  double *pdVar1;
  JavascriptLibrary *this_00;
  RecyclableObject *pRVar2;
  double *dateInfo;
  ScriptContext *ctx;
  InflateMap *inflator_local;
  SnapObject *snpObject_local;
  
  this = InflateMap::LookupScriptContext(inflator,snpObject->SnapType->ScriptContextLogId);
  pdVar1 = SnapObjectGetAddtlInfoAs<double*,(TTD::NSSnapObjects::SnapObjectType)16>(snpObject);
  this_00 = Js::ScriptContext::GetLibrary(this);
  pRVar2 = Js::JavascriptLibrary::CreateDate_TTD(this_00,*pdVar1);
  return pRVar2;
}

Assistant:

Js::RecyclableObject* DoObjectInflation_SnapDate(const SnapObject* snpObject, InflateMap* inflator)
        {
            //Dates are not too common and have some mutable state so it seems easiest to always re-create them.
            //We can re-evaluate this choice later if needed.

            Js::ScriptContext* ctx = inflator->LookupScriptContext(snpObject->SnapType->ScriptContextLogId);
            double* dateInfo = SnapObjectGetAddtlInfoAs<double*, SnapObjectType::SnapDateObject>(snpObject);

            return ctx->GetLibrary()->CreateDate_TTD(*dateInfo);
        }